

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_writer.cc
# Opt level: O3

void __thiscall
google::protobuf::util::converter::ObjectWriter::RenderDataPieceTo
          (ObjectWriter *this,DataPiece *data,StringPiece name,ObjectWriter *ow)

{
  undefined8 uVar1;
  long *plVar2;
  char *pcVar3;
  undefined1 local_78 [40];
  float local_50;
  undefined4 uStack_4c;
  size_t local_48;
  undefined1 local_40 [16];
  
  plVar2 = (long *)name.length_;
  pcVar3 = name.ptr_;
  switch(*(undefined4 *)&this->use_strict_base64_decoding_) {
  case 1:
    DataPiece::ToInt32((StatusOr<int> *)local_78,(DataPiece *)this);
    if (local_78._0_4_ != OK) {
      internal::StatusOrHelper::Crash((Status *)local_78);
    }
    (**(code **)(*plVar2 + 0x38))(plVar2,data,pcVar3,local_50);
    break;
  case 2:
    DataPiece::ToInt64((StatusOr<long> *)local_78,(DataPiece *)this);
    if (local_78._0_4_ != OK) {
      internal::StatusOrHelper::Crash((Status *)local_78);
    }
    (**(code **)(*plVar2 + 0x48))(plVar2,data,pcVar3,CONCAT44(uStack_4c,local_50));
    break;
  case 3:
    DataPiece::ToUint32((StatusOr<unsigned_int> *)local_78,(DataPiece *)this);
    if (local_78._0_4_ != OK) {
      internal::StatusOrHelper::Crash((Status *)local_78);
    }
    (**(code **)(*plVar2 + 0x40))(plVar2,data,pcVar3,local_50);
    break;
  case 4:
    DataPiece::ToUint64((StatusOr<unsigned_long> *)local_78,(DataPiece *)this);
    if (local_78._0_4_ != OK) {
      internal::StatusOrHelper::Crash((Status *)local_78);
    }
    (**(code **)(*plVar2 + 0x50))(plVar2,data,pcVar3,CONCAT44(uStack_4c,local_50));
    break;
  case 5:
    DataPiece::ToDouble((StatusOr<double> *)local_78,(DataPiece *)this);
    if (local_78._0_4_ != OK) {
      internal::StatusOrHelper::Crash((Status *)local_78);
    }
    (**(code **)(*plVar2 + 0x58))(CONCAT44(uStack_4c,local_50),plVar2,data,pcVar3);
    break;
  case 6:
    DataPiece::ToFloat((StatusOr<float> *)local_78,(DataPiece *)this);
    if (local_78._0_4_ != OK) {
      internal::StatusOrHelper::Crash((Status *)local_78);
    }
    (**(code **)(*plVar2 + 0x60))(local_50,plVar2,data,pcVar3);
    break;
  case 7:
    DataPiece::ToBool((StatusOr<bool> *)local_78,(DataPiece *)this);
    if (local_78._0_4_ != OK) {
      internal::StatusOrHelper::Crash((Status *)local_78);
    }
    (**(code **)(*plVar2 + 0x30))(plVar2,data,pcVar3,local_50._0_1_);
    break;
  default:
    goto switchD_00310835_caseD_8;
  case 9:
    DataPiece::ToString_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_78,(DataPiece *)this);
    if (local_78._0_4_ != OK) {
      internal::StatusOrHelper::Crash((Status *)local_78);
    }
    uVar1 = CONCAT44(uStack_4c,local_50);
    if ((long)local_48 < 0) {
      StringPiece::LogFatalSizeTooBig(local_48,"size_t to int conversion");
    }
    (**(code **)(*plVar2 + 0x68))(plVar2,data,pcVar3,uVar1,local_48);
    goto LAB_00310a5f;
  case 10:
    DataPiece::ToBytes_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_78,(DataPiece *)this);
    if (local_78._0_4_ != OK) {
      internal::StatusOrHelper::Crash((Status *)local_78);
    }
    uVar1 = CONCAT44(uStack_4c,local_50);
    if ((long)local_48 < 0) {
      StringPiece::LogFatalSizeTooBig(local_48,"size_t to int conversion");
    }
    (**(code **)(*plVar2 + 0x70))(plVar2,data,pcVar3,uVar1,local_48);
LAB_00310a5f:
    if ((undefined1 *)CONCAT44(uStack_4c,local_50) != local_40) {
      operator_delete((undefined1 *)CONCAT44(uStack_4c,local_50));
    }
    break;
  case 0xb:
    (**(code **)(*plVar2 + 0x78))(plVar2,data,pcVar3);
    return;
  }
  if ((undefined1 *)local_78._8_8_ != local_78 + 0x18) {
    operator_delete((void *)local_78._8_8_);
  }
switchD_00310835_caseD_8:
  return;
}

Assistant:

void ObjectWriter::RenderDataPieceTo(const DataPiece& data,
                                     StringPiece name, ObjectWriter* ow) {
  switch (data.type()) {
    case DataPiece::TYPE_INT32: {
      ow->RenderInt32(name, data.ToInt32().value());
      break;
    }
    case DataPiece::TYPE_INT64: {
      ow->RenderInt64(name, data.ToInt64().value());
      break;
    }
    case DataPiece::TYPE_UINT32: {
      ow->RenderUint32(name, data.ToUint32().value());
      break;
    }
    case DataPiece::TYPE_UINT64: {
      ow->RenderUint64(name, data.ToUint64().value());
      break;
    }
    case DataPiece::TYPE_DOUBLE: {
      ow->RenderDouble(name, data.ToDouble().value());
      break;
    }
    case DataPiece::TYPE_FLOAT: {
      ow->RenderFloat(name, data.ToFloat().value());
      break;
    }
    case DataPiece::TYPE_BOOL: {
      ow->RenderBool(name, data.ToBool().value());
      break;
    }
    case DataPiece::TYPE_STRING: {
      ow->RenderString(name, data.ToString().value());
      break;
    }
    case DataPiece::TYPE_BYTES: {
      ow->RenderBytes(name, data.ToBytes().ValueOrDie());
      break;
    }
    case DataPiece::TYPE_NULL: {
      ow->RenderNull(name);
      break;
    }
    default:
      break;
  }
}